

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_common.c
# Opt level: O3

rt_function_error_t free_convolution_local_context_common(rt_function_t *f)

{
  void *pvVar1;
  rt_list_t s;
  rt_list_t s_00;
  rt_list_t s_01;
  rt_list_t s_02;
  rt_list_t s_03;
  rt_list_t s_04;
  rt_list_t s_05;
  rt_list_t s_06;
  rt_list_t s_07;
  rt_list_t s_08;
  rt_list_t s_09;
  rt_list_t s_10;
  rt_list_t s_11;
  rt_list_t s_12;
  rt_list_t s_13;
  
  pvVar1 = *f->local_context;
  s._4_4_ = 0;
  s.size = *(uint *)((long)pvVar1 + 8);
  s.data = *(int **)((long)pvVar1 + 0x10);
  free_list(s);
  s_00._4_4_ = 0;
  s_00.size = *(uint *)((long)pvVar1 + 0x18);
  s_00.data = *(int **)((long)pvVar1 + 0x20);
  free_list(s_00);
  s_01._4_4_ = 0;
  s_01.size = *(uint *)((long)pvVar1 + 0x48);
  s_01.data = *(int **)((long)pvVar1 + 0x50);
  free_list(s_01);
  s_02._4_4_ = 0;
  s_02.size = *(uint *)((long)pvVar1 + 0x58);
  s_02.data = *(int **)((long)pvVar1 + 0x60);
  free_list(s_02);
  s_03._4_4_ = 0;
  s_03.size = *(uint *)((long)pvVar1 + 0x88);
  s_03.data = *(int **)((long)pvVar1 + 0x90);
  free_list(s_03);
  s_04._4_4_ = 0;
  s_04.size = *(uint *)((long)pvVar1 + 0x98);
  s_04.data = *(int **)((long)pvVar1 + 0xa0);
  free_list(s_04);
  if (*(long *)((long)pvVar1 + 0xc0) != 0) {
    s_05._4_4_ = 0;
    s_05.size = *(uint *)((long)pvVar1 + 200);
    s_05.data = *(int **)((long)pvVar1 + 0xd0);
    free_list(s_05);
    s_06._4_4_ = 0;
    s_06.size = *(uint *)((long)pvVar1 + 0xd8);
    s_06.data = *(int **)((long)pvVar1 + 0xe0);
    free_list(s_06);
  }
  if (*(long *)((long)pvVar1 + 0x100) != 0) {
    s_07._4_4_ = 0;
    s_07.size = *(uint *)((long)pvVar1 + 0x108);
    s_07.data = *(int **)((long)pvVar1 + 0x110);
    free_list(s_07);
    s_08._4_4_ = 0;
    s_08.size = *(uint *)((long)pvVar1 + 0x118);
    s_08.data = *(int **)((long)pvVar1 + 0x120);
    free_list(s_08);
  }
  s_09._4_4_ = 0;
  s_09.size = *(uint *)((long)pvVar1 + 0x148);
  s_09.data = *(int **)((long)pvVar1 + 0x150);
  free_list(s_09);
  s_10._4_4_ = 0;
  s_10.size = *(uint *)((long)pvVar1 + 0x158);
  s_10.data = *(int **)((long)pvVar1 + 0x160);
  free_list(s_10);
  s_11._4_4_ = 0;
  s_11.size = *(uint *)((long)pvVar1 + 0x178);
  s_11.data = *(int **)((long)pvVar1 + 0x180);
  free_list(s_11);
  s_12._4_4_ = 0;
  s_12.size = *(uint *)((long)pvVar1 + 0x188);
  s_12.data = *(int **)((long)pvVar1 + 400);
  free_list(s_12);
  s_13._4_4_ = 0;
  s_13.size = *(uint *)((long)pvVar1 + 0x168);
  s_13.data = *(int **)((long)pvVar1 + 0x170);
  free_list(s_13);
  (*rt_free_func)(pvVar1);
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t free_convolution_local_context_common(rt_function_t *f) {
  convolution_local_context_t *c =
      (convolution_local_context_t *)(f->local_context);
  convolution_private_t *p = (convolution_private_t *)c->data;
  var_free(&p->out_var);
  var_free(&p->in_var);
  var_free(&p->w_var);
  if (p->b_var.v != 0)
    var_free(&p->b_var);
  if (p->a_var.v != 0)
    var_free(&p->a_var);
  free_list(p->input_shape);
  free_list(p->kernel_shape);
  free_list(p->in_position);
  free_list(p->out_position);
  free_list(p->output_shape);
  rt_free_func(p);
  return RT_FUNCTION_ERROR_NOERROR;
}